

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O0

uint __thiscall Kernel::Clause::getLiteralPosition(Clause *this,Literal *lit)

{
  uint uVar1;
  Literal **ppLVar2;
  size_t sVar3;
  Literal *in_RSI;
  Clause *in_RDI;
  Literal *in_stack_ffffffffffffff98;
  InverseLookup<Kernel::Literal> *in_stack_ffffffffffffffa0;
  size_t in_stack_ffffffffffffffc0;
  Literal *pLVar4;
  Literal **in_stack_ffffffffffffffc8;
  uint local_4;
  
  uVar1 = length(in_RDI);
  if (uVar1 == 1) {
    local_4 = 0;
  }
  else if (uVar1 == 2) {
    ppLVar2 = operator[](in_RDI,0);
    if (in_RSI == *ppLVar2) {
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  else if (uVar1 == 3) {
    pLVar4 = in_RSI;
    ppLVar2 = operator[](in_RDI,0);
    if (pLVar4 == *ppLVar2) {
      local_4 = 0;
    }
    else {
      ppLVar2 = operator[](in_RDI,1);
      if (in_RSI == *ppLVar2) {
        local_4 = 1;
      }
      else {
        local_4 = 2;
      }
    }
  }
  else {
    if (in_RDI->_literalPositions == (InverseLookup<Kernel::Literal> *)0x0) {
      in_stack_ffffffffffffffa0 =
           (InverseLookup<Kernel::Literal> *)
           Lib::InverseLookup<Kernel::Literal>::operator_new(0x8455b3);
      length(in_RDI);
      Lib::InverseLookup<Kernel::Literal>::InverseLookup<Kernel::Literal**>
                ((InverseLookup<Kernel::Literal> *)in_RDI,in_stack_ffffffffffffffc8,
                 in_stack_ffffffffffffffc0);
      in_RDI->_literalPositions = in_stack_ffffffffffffffa0;
    }
    sVar3 = Lib::InverseLookup<Kernel::Literal>::get
                      (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    local_4 = (uint)sVar3;
  }
  return local_4;
}

Assistant:

unsigned Clause::getLiteralPosition(Literal* lit)
{
  switch(length()) {
  case 1:
    ASS_EQ(lit,(*this)[0]);
    return 0;
  case 2:
    if (lit==(*this)[0]) {
      return 0;
    } else {
      ASS_EQ(lit,(*this)[1]);
      return 1;
    }
  case 3:
    if (lit==(*this)[0]) {
      return 0;
    } else if (lit==(*this)[1]) {
      return 1;
    } else {
      ASS_EQ(lit,(*this)[2]);
      return 2;
    }
#if VDEBUG
  case 0:
    ASSERTION_VIOLATION;
#endif
  default:
    if (!_literalPositions) {
      _literalPositions=new InverseLookup<Literal>(_literals,length());
    }
    return static_cast<unsigned>(_literalPositions->get(lit));
  }
}